

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::ShaderSubroutine::FunctionalTest14_15::iterate(FunctionalTest14_15 *this)

{
  pointer *ppuVar1;
  bool bVar2;
  bool bVar3;
  GLuint GVar4;
  int iVar5;
  MessageBuilder *pMVar6;
  NotSupportedError *this_00;
  socklen_t __len;
  undefined8 uVar7;
  sockaddr *__addr;
  char *description;
  GLchar *(*papGVar8) [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar9;
  GLuint *pGVar10;
  vec4<unsigned_int> *expected_routine_2_result;
  GLuint (*paGVar11) [2];
  GLuint (*value) [2];
  GLuint i;
  vec4<unsigned_int> *uni_input;
  long lVar12;
  long lVar13;
  vec4<unsigned_int> *expected_routine_1_result;
  GLuint *local_218;
  GLenum binary_format;
  buffer transform_feedback_buffer;
  vertexArray vao;
  program program;
  vector<unsigned_char,_std::allocator<unsigned_char>_> program_binary;
  
  if (iterate()::uni_input == '\0') {
    iVar5 = __cxa_guard_acquire(&iterate()::uni_input);
    if (iVar5 != 0) {
      iterate::uni_input[0] = _DAT_016a9820;
      iterate::uni_input[1] = _DAT_016a9820;
      __cxa_guard_release(&iterate()::uni_input);
    }
  }
  if (iterate()::out_routine_1 == '\0') {
    iVar5 = __cxa_guard_acquire(&iterate()::out_routine_1);
    if (iVar5 != 0) {
      iterate::out_routine_1[0] = _DAT_016a9830;
      iterate::out_routine_1[1] = _DAT_016a9840;
      __cxa_guard_release(&iterate()::out_routine_1);
    }
  }
  if (iterate()::out_routine_2 == '\0') {
    iVar5 = __cxa_guard_acquire(&iterate()::out_routine_2);
    if (iVar5 != 0) {
      iterate::out_routine_2[0] = _DAT_016a9850;
      iterate::out_routine_2[1] = _DAT_016a9860;
      __cxa_guard_release(&iterate()::out_routine_2);
    }
  }
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (bVar2) {
    transform_feedback_buffer.m_context = (this->super_TestCase).m_context;
    program.m_tesselation_control_shader_id = 0;
    program.m_tesselation_evaluation_shader_id = 0;
    program.m_vertex_shader_id = 0;
    program.m_compute_shader_id = 0;
    program.m_fragment_shader_id = 0;
    program.m_geometry_shader_id = 0;
    program.m_program_object_id = 0;
    transform_feedback_buffer.m_id = 0;
    vao.m_id = 0;
    vao.m_context = transform_feedback_buffer.m_context;
    program.m_context = transform_feedback_buffer.m_context;
    bVar2 = Utils::program::isProgramBinarySupported(&program);
    iVar5 = 0;
    uVar7 = 0;
    Utils::program::build
              (&program,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,
               "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\nstruct data\n{\n    uint r;\n    uint g;\n    uint b;\n    uint a;\n};\n\nsubroutine void routine_type_1(in data iparam, out data oparam);\nsubroutine void routine_type_2(inout data arg);\n\nsubroutine (routine_type_1) void invert(in data iparam, out data oparam)\n{\n    oparam.r = iparam.a;\n    oparam.g = iparam.b;\n    oparam.b = iparam.g;\n    oparam.a = iparam.r;\n}\n\nsubroutine (routine_type_1) void increment(in data iparam, out data oparam)\n{\n    oparam.r = 1 + iparam.r;\n    oparam.g = 1 + iparam.g;\n    oparam.b = 1 + iparam.b;\n    oparam.a = 1 + iparam.a;\n}\n\nsubroutine (routine_type_2) void div_by_2(inout data arg)\n{\n    arg.r = arg.r / 2;\n    arg.g = arg.g / 2;\n    arg.b = arg.b / 2;\n    arg.a = arg.a / 2;\n}\n\nsubroutine (routine_type_2) void decrement(inout data arg)\n{\n    arg.r = arg.r - 1;\n    arg.g = arg.g - 1;\n    arg.b = arg.b - 1;\n    arg.a = arg.a - 1;\n}\n\nsubroutine uniform routine_type_1 routine_1;\nsubroutine uniform routine_type_2 routine_2;\n\nuniform uvec4 uni_input;\n\nout uvec4 out_routine_1;\nout uvec4 out_routine_2;\n\n\nvoid main()\n{\n    data routine_1_input;\n    data routine_1_output;\n    data routine_2_arg;\n\n    routine_1_input.r = uni_input.r;\n    routine_1_input.g = uni_input.g;\n    routine_1_input.b = uni_input.b;\n    routine_1_input.a = uni_input.a;\n\n    routine_2_arg.r = uni_input.r;\n    routine_2_arg.g = uni_input.g;\n    routine_2_arg.b = uni_input.b;\n    routine_2_arg.a = uni_input.a;\n\n    routine_1(routine_1_input, routine_1_output);\n    routine_2(routine_2_arg);\n\n    out_routine_1.r = routine_1_output.r;\n    out_routine_1.g = routine_1_output.g;\n    out_routine_1.b = routine_1_output.b;\n    out_routine_1.a = routine_1_output.a;\n\n    out_routine_2.r = routine_2_arg.r;\n    out_routine_2.g = routine_2_arg.g;\n    out_routine_2.b = routine_2_arg.b;\n    out_routine_2.a = routine_2_arg.a;\n}\n\n"
               ,iterate::varying_names,2,false);
    __len = (socklen_t)uVar7;
    if (bVar2) {
      for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 8) {
        GVar4 = Utils::program::getSubroutineIndex
                          (&program,*(GLchar **)((long)iterate::subroutine_names[0] + lVar13 * 2),
                           0x8b31);
        *(GLuint *)((long)this->m_initial_subroutine_indices[0] + lVar13) = GVar4;
        GVar4 = Utils::program::getSubroutineIndex
                          (&program,*(GLchar **)
                                     ((long)iterate::subroutine_names[0] + lVar13 * 2 + 8),0x8b31);
        *(GLuint *)((long)this->m_initial_subroutine_indices[0] + lVar13 + 4) = GVar4;
      }
      pGVar10 = this->m_initial_subroutine_uniform_locations;
      for (lVar13 = 0; __len = (socklen_t)uVar7, lVar13 != 0x10; lVar13 = lVar13 + 8) {
        GVar4 = Utils::program::getSubroutineUniformLocation
                          (&program,*(GLchar **)((long)iterate::subroutine_uniform_names + lVar13),
                           0x8b31);
        *pGVar10 = GVar4;
        pGVar10 = pGVar10 + 1;
      }
      pvVar9 = &program_binary;
      program_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      program_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      program_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Utils::program::getBinary(&program,pvVar9,&binary_format);
      Utils::program::remove(&program,(char *)pvVar9);
      pvVar9 = &program_binary;
      Utils::program::createFromBinary(&program,pvVar9,binary_format);
      iVar5 = (int)pvVar9;
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&program_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    Utils::program::use(&program);
    Utils::vertexArray::generate(&vao);
    Utils::vertexArray::bind(&vao,iVar5,__addr,__len);
    Utils::buffer::generate(&transform_feedback_buffer);
    Utils::buffer::update(&transform_feedback_buffer,0x8c8e,0x20,(GLvoid *)0x0,0x88ea);
    Utils::buffer::bindRange(&transform_feedback_buffer,0x8c8e,0,0,0x20);
    papGVar8 = iterate::subroutine_names;
    paGVar11 = this->m_subroutine_indices;
    for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 8) {
      GVar4 = Utils::program::getSubroutineIndex
                        (&program,*(GLchar **)((long)iterate::subroutine_names[0] + lVar13 * 2),
                         0x8b31);
      *(GLuint *)((long)this->m_subroutine_indices[0] + lVar13) = GVar4;
      GVar4 = Utils::program::getSubroutineIndex
                        (&program,*(GLchar **)((long)iterate::subroutine_names[0] + lVar13 * 2 + 8),
                         0x8b31);
      *(GLuint *)((long)this->m_subroutine_indices[0] + lVar13 + 4) = GVar4;
    }
    local_218 = this->m_subroutine_uniform_locations;
    pGVar10 = local_218;
    for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 8) {
      GVar4 = Utils::program::getSubroutineUniformLocation
                        (&program,*(GLchar **)((long)iterate::subroutine_uniform_names + lVar13),
                         0x8b31);
      *pGVar10 = GVar4;
      pGVar10 = pGVar10 + 1;
    }
    GVar4 = Utils::program::getUniformLocation(&program,"uni_input");
    this->m_uniform_location = GVar4;
    bVar3 = true;
    if (bVar2) {
      bVar2 = testIndicesAndLocations(this);
      if (!bVar2) {
        program_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((this->super_TestCase).m_context)->m_testCtx->m_log;
        ppuVar1 = &program_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
        std::operator<<((ostream *)ppuVar1,
                        "Error. Subroutine indices or subroutine uniform location changed.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&program_binary,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar1);
        ppuVar1 = &program_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
          value = paGVar11;
          for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 8) {
            program_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start =
                 (pointer)((this->super_TestCase).m_context)->m_testCtx->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
            std::operator<<((ostream *)ppuVar1,"Subroutine: ");
            pMVar6 = tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)&program_binary,
                                (char **)((long)*papGVar8 + lVar12));
            std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                            " index: ");
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,*value);
            std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                            " initial index: ");
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)((long)(value + 3) + 4));
            tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar1);
            value = (GLuint (*) [2])(*value + 1);
          }
          papGVar8 = papGVar8 + 1;
          paGVar11 = paGVar11 + 1;
        }
        ppuVar1 = &program_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 8) {
          program_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((this->super_TestCase).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
          std::operator<<((ostream *)ppuVar1,"Subroutine uniform: ");
          pMVar6 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)&program_binary,
                              (char **)((long)iterate::subroutine_uniform_names + lVar13));
          std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                          " location: ");
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_218);
          std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                          " initial location: ");
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_218 + 7);
          tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar1);
          local_218 = local_218 + 1;
        }
      }
      bVar3 = testDefaultSubroutineSet
                        (this,iterate::uni_input,iterate::out_routine_1,iterate::out_routine_2);
      bVar3 = bVar3 && bVar2;
    }
    uni_input = iterate::uni_input;
    expected_routine_1_result = iterate::out_routine_1;
    expected_routine_2_result = iterate::out_routine_2;
    for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
      bVar2 = testDraw(this,(GLuint)lVar13,uni_input,expected_routine_1_result,
                       expected_routine_2_result);
      bVar3 = (bool)(bVar3 & bVar2);
      uni_input = uni_input + 1;
      expected_routine_1_result = expected_routine_1_result + 1;
      expected_routine_2_result = expected_routine_2_result + 1;
    }
    description = "Fail";
    if (bVar3 != false) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (byte)~bVar3 & QP_TEST_RESULT_FAIL,description);
    Utils::vertexArray::~vertexArray(&vao);
    Utils::buffer::~buffer(&transform_feedback_buffer);
    Utils::program::~program(&program);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program_binary,"GL_ARB_shader_subroutine is not supported.",
             (allocator<char> *)&program);
  tcu::NotSupportedError::NotSupportedError(this_00,(string *)&program_binary);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest14_15::iterate()
{
	static const GLchar* vertex_shader_code =
		"#version 400 core\n"
		"#extension GL_ARB_shader_subroutine : require\n"
		"\n"
		"precision highp float;\n"
		"\n"
		"struct data\n"
		"{\n"
		"    uint r;\n"
		"    uint g;\n"
		"    uint b;\n"
		"    uint a;\n"
		"};\n"
		"\n"
		"subroutine void routine_type_1(in data iparam, out data oparam);\n"
		"subroutine void routine_type_2(inout data arg);\n"
		"\n"
		"subroutine (routine_type_1) void invert(in data iparam, out data oparam)\n"
		"{\n"
		"    oparam.r = iparam.a;\n"
		"    oparam.g = iparam.b;\n"
		"    oparam.b = iparam.g;\n"
		"    oparam.a = iparam.r;\n"
		"}\n"
		"\n"
		"subroutine (routine_type_1) void increment(in data iparam, out data oparam)\n"
		"{\n"
		"    oparam.r = 1 + iparam.r;\n"
		"    oparam.g = 1 + iparam.g;\n"
		"    oparam.b = 1 + iparam.b;\n"
		"    oparam.a = 1 + iparam.a;\n"
		"}\n"
		"\n"
		"subroutine (routine_type_2) void div_by_2(inout data arg)\n"
		"{\n"
		"    arg.r = arg.r / 2;\n"
		"    arg.g = arg.g / 2;\n"
		"    arg.b = arg.b / 2;\n"
		"    arg.a = arg.a / 2;\n"
		"}\n"
		"\n"
		"subroutine (routine_type_2) void decrement(inout data arg)\n"
		"{\n"
		"    arg.r = arg.r - 1;\n"
		"    arg.g = arg.g - 1;\n"
		"    arg.b = arg.b - 1;\n"
		"    arg.a = arg.a - 1;\n"
		"}\n"
		"\n"
		"subroutine uniform routine_type_1 routine_1;\n"
		"subroutine uniform routine_type_2 routine_2;\n"
		"\n"
		"uniform uvec4 uni_input;\n"
		"\n"
		"out uvec4 out_routine_1;\n"
		"out uvec4 out_routine_2;\n"
		"\n"
		"\n"
		"void main()\n"
		"{\n"
		"    data routine_1_input;\n"
		"    data routine_1_output;\n"
		"    data routine_2_arg;\n"
		"\n"
		"    routine_1_input.r = uni_input.r;\n"
		"    routine_1_input.g = uni_input.g;\n"
		"    routine_1_input.b = uni_input.b;\n"
		"    routine_1_input.a = uni_input.a;\n"
		"\n"
		"    routine_2_arg.r = uni_input.r;\n"
		"    routine_2_arg.g = uni_input.g;\n"
		"    routine_2_arg.b = uni_input.b;\n"
		"    routine_2_arg.a = uni_input.a;\n"
		"\n"
		"    routine_1(routine_1_input, routine_1_output);\n"
		"    routine_2(routine_2_arg);\n"
		"\n"
		"    out_routine_1.r = routine_1_output.r;\n"
		"    out_routine_1.g = routine_1_output.g;\n"
		"    out_routine_1.b = routine_1_output.b;\n"
		"    out_routine_1.a = routine_1_output.a;\n"
		"\n"
		"    out_routine_2.r = routine_2_arg.r;\n"
		"    out_routine_2.g = routine_2_arg.g;\n"
		"    out_routine_2.b = routine_2_arg.b;\n"
		"    out_routine_2.a = routine_2_arg.a;\n"
		"}\n"
		"\n";

	static const GLchar* subroutine_names[][2] = { { "invert", "increment" }, { "div_by_2", "decrement" } };
	static const GLuint  n_subroutine_types	= sizeof(subroutine_names) / sizeof(subroutine_names[0]);

	static const GLchar* subroutine_uniform_names[] = { "routine_1", "routine_2" };
	static const GLuint  n_subroutine_uniform_names =
		sizeof(subroutine_uniform_names) / sizeof(subroutine_uniform_names[0]);

	static const GLchar* uniform_name	= "uni_input";
	static const GLchar* varying_names[] = { "out_routine_1", "out_routine_2" };

	static const GLuint n_varying_names				   = sizeof(varying_names) / sizeof(varying_names[0]);
	static const GLuint transform_feedback_buffer_size = n_varying_names * 4 * sizeof(GLuint);

	/* Test data */
	static const Utils::vec4<GLuint> uni_input[] = { Utils::vec4<GLuint>(8, 64, 4096, 16777216),
													 Utils::vec4<GLuint>(8, 64, 4096, 16777216) };

	static const Utils::vec4<GLuint> out_routine_1[] = { Utils::vec4<GLuint>(16777216, 4096, 64, 8),
														 Utils::vec4<GLuint>(9, 65, 4097, 16777217) };

	static const Utils::vec4<GLuint> out_routine_2[] = { Utils::vec4<GLuint>(4, 32, 2048, 8388608),
														 Utils::vec4<GLuint>(7, 63, 4095, 16777215) };

	static const GLuint n_test_cases = 2;

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* GL objects */
	Utils::program	 program(m_context);
	Utils::buffer	  transform_feedback_buffer(m_context);
	Utils::vertexArray vao(m_context);

	bool is_program_binary_supported = program.isProgramBinarySupported();

	/* Init GL objects */
	program.build(0 /* cs */, 0 /* fs */, 0 /* gs */, 0 /* tcs */, 0 /* test */, vertex_shader_code,
				  varying_names /* varying_names */, n_varying_names /* n_varyings */);

	/* Do not execute the test if GL_ARB_get_program_binary is not supported */
	if (true == is_program_binary_supported)
	{
		/* Get subroutine indices */
		for (GLuint type = 0; type < n_subroutine_types; ++type)
		{
			m_initial_subroutine_indices[type][0] =
				program.getSubroutineIndex(subroutine_names[type][0], GL_VERTEX_SHADER);

			m_initial_subroutine_indices[type][1] =
				program.getSubroutineIndex(subroutine_names[type][1], GL_VERTEX_SHADER);
		}

		/* Get subroutine uniform locations */
		for (GLuint uniform = 0; uniform < n_subroutine_uniform_names; ++uniform)
		{
			m_initial_subroutine_uniform_locations[uniform] =
				program.getSubroutineUniformLocation(subroutine_uniform_names[uniform], GL_VERTEX_SHADER);
		}

		/* Delete program and recreate it from binary */
		std::vector<GLubyte> program_binary;
		GLenum				 binary_format;

		program.getBinary(program_binary, binary_format);
		program.remove();
		program.createFromBinary(program_binary, binary_format);
	}

	program.use();

	vao.generate();
	vao.bind();

	transform_feedback_buffer.generate();
	transform_feedback_buffer.update(GL_TRANSFORM_FEEDBACK_BUFFER, transform_feedback_buffer_size, 0 /* data */,
									 GL_DYNAMIC_COPY);
	transform_feedback_buffer.bindRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 0, transform_feedback_buffer_size);

	/* Get subroutine indices */
	for (GLuint type = 0; type < n_subroutine_types; ++type)
	{
		m_subroutine_indices[type][0] = program.getSubroutineIndex(subroutine_names[type][0], GL_VERTEX_SHADER);
		m_subroutine_indices[type][1] = program.getSubroutineIndex(subroutine_names[type][1], GL_VERTEX_SHADER);
	}

	/* Get subroutine uniform locations */
	for (GLuint uniform = 0; uniform < n_subroutine_uniform_names; ++uniform)
	{
		m_subroutine_uniform_locations[uniform] =
			program.getSubroutineUniformLocation(subroutine_uniform_names[uniform], GL_VERTEX_SHADER);
	}

	/* Get uniform locations */
	m_uniform_location = program.getUniformLocation(uniform_name);

	/* Test */
	bool result = true;

	/* Test program binary */
	if (true == is_program_binary_supported)
	{
		/* Test indices and locations */
		if (false == testIndicesAndLocations())
		{
			static const GLuint n_subroutines_per_type = 2;

			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Error. Subroutine indices or subroutine uniform location changed."
												<< tcu::TestLog::EndMessage;

			for (GLuint type = 0; type < n_subroutine_types; ++type)
			{
				for (GLuint i = 0; i < n_subroutines_per_type; ++i)
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "Subroutine: " << subroutine_names[type][i]
						<< " index: " << m_subroutine_indices[type][i]
						<< " initial index: " << m_initial_subroutine_indices[type][i] << tcu::TestLog::EndMessage;
				}
			}

			for (GLuint uniform = 0; uniform < n_subroutine_uniform_names; ++uniform)
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Subroutine uniform: " << subroutine_uniform_names[uniform]
					<< " location: " << m_subroutine_uniform_locations[uniform]
					<< " initial location: " << m_initial_subroutine_uniform_locations[uniform]
					<< tcu::TestLog::EndMessage;
			}

			result = false;
		}

		/* Test draw with deafult set of subroutines */
		if (false == testDefaultSubroutineSet(uni_input[0], out_routine_1, out_routine_2))
		{
			result = false;
		}
	}

	for (GLuint i = 0; i < n_test_cases; ++i)
	{
		if (false == testDraw(i, uni_input[i], out_routine_1[i], out_routine_2[i]))
		{
			result = false;
		}
	}

	/* Set result */
	if (true == result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}